

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[19],_QByteArray>,_const_char_(&)[15]>,_QByteArray>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[19],_QByteArray>,_const_char_(&)[15]>,_QByteArray>
                  *this)

{
  QByteArray::~QByteArray((QByteArray *)0x6a3a00);
  QStringBuilder<QStringBuilder<const_char_(&)[19],_QByteArray>,_const_char_(&)[15]>::
  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[19],_QByteArray>,_const_char_(&)[15]>
                   *)0x6a3a0a);
  return;
}

Assistant:

~QStringBuilder() = default;